

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int push_change_cipher_spec(ptls_t *tls,ptls_buffer_t *sendbuf)

{
  size_t sVar1;
  int iVar2;
  long lVar3;
  undefined1 local_24;
  undefined1 local_23 [3];
  
  iVar2 = 0;
  if ((((tls->field_0x160 & 4) != 0) &&
      (iVar2 = ptls_buffer__do_pushv(sendbuf,local_23,3), iVar2 == 0)) &&
     (iVar2 = ptls_buffer__do_pushv(sendbuf,"",2), iVar2 == 0)) {
    sVar1 = sendbuf->off;
    iVar2 = ptls_buffer__do_pushv(sendbuf,&local_24,1);
    if (iVar2 == 0) {
      lVar3 = sendbuf->off - sVar1;
      sendbuf->base[sVar1 - 2] = (uint8_t)((ulong)lVar3 >> 8);
      sendbuf->base[sVar1 - 1] = (uint8_t)lVar3;
      tls->field_0x160 = tls->field_0x160 & 0xfb;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int push_change_cipher_spec(ptls_t *tls, ptls_buffer_t *sendbuf)
{
    int ret = 0;

    if (!tls->send_change_cipher_spec)
        goto Exit;
    buffer_push_record(sendbuf, PTLS_CONTENT_TYPE_CHANGE_CIPHER_SPEC, { ptls_buffer_push(sendbuf, 1); });
    tls->send_change_cipher_spec = 0;
Exit:
    return ret;
}